

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.cxx
# Opt level: O0

void __thiscall
cmDebugger::cmDebuggerVariables::EnumerateSubVariablesIfAny
          (cmDebuggerVariables *this,array<dap::Variable> *toBeReturned)

{
  pointer this_00;
  bool bVar1;
  element_type *peVar2;
  int64_t i;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  Variable local_1b8;
  __shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_50;
  shared_ptr<cmDebugger::cmDebuggerVariables> *variables;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
  *__range1;
  array<dap::Variable> ret;
  array<dap::Variable> *toBeReturned_local;
  cmDebuggerVariables *this_local;
  
  ret.super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)toBeReturned;
  std::vector<dap::Variable,_std::allocator<dap::Variable>_>::vector
            ((vector<dap::Variable,_std::allocator<dap::Variable>_> *)&__range1);
  __end1 = std::
           vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
           ::begin(&this->SubVariables);
  variables = (shared_ptr<cmDebugger::cmDebuggerVariables> *)
              std::
              vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
              ::end(&this->SubVariables);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::shared_ptr<cmDebugger::cmDebuggerVariables>_*,_std::vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>_>
                                *)&variables);
    if (!bVar1) break;
    local_50 = (__shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<const_std::shared_ptr<cmDebugger::cmDebuggerVariables>_*,_std::vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>_>
                  ::operator*(&__end1);
    this_00 = ret.super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    local_1b8.evaluateName.val.field_2._M_allocated_capacity = 0;
    local_1b8.evaluateName.val.field_2._8_8_ = 0;
    local_1b8.evaluateName.val._M_dataplus = (_Alloc_hider)0x0;
    local_1b8.evaluateName.val._1_7_ = 0;
    local_1b8.evaluateName.val._M_string_length = 0;
    local_1b8.evaluateName.set = false;
    local_1b8.evaluateName._33_7_ = 0;
    dap::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(&local_1b8.evaluateName);
    local_1b8.indexedVariables.val.val = 0;
    local_1b8.indexedVariables.set = false;
    local_1b8.indexedVariables._9_7_ = 0;
    dap::optional<dap::integer>::optional(&local_1b8.indexedVariables);
    local_1b8.memoryReference.val.field_2._M_allocated_capacity = 0;
    local_1b8.memoryReference.val.field_2._8_8_ = 0;
    local_1b8.memoryReference.val._M_dataplus = (_Alloc_hider)0x0;
    local_1b8.memoryReference.val._1_7_ = 0;
    local_1b8.memoryReference.val._M_string_length = 0;
    local_1b8.memoryReference.set = false;
    local_1b8.memoryReference._33_7_ = 0;
    dap::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(&local_1b8.memoryReference);
    peVar2 = std::
             __shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_50);
    GetName_abi_cxx11_(&local_1b8.name,peVar2);
    local_1b8.namedVariables.val.val = 0;
    local_1b8.namedVariables.set = false;
    local_1b8.namedVariables._9_7_ = 0;
    dap::optional<dap::integer>::optional(&local_1b8.namedVariables);
    dap::optional<dap::VariablePresentationHint>::
    optional<dap::VariablePresentationHint_const&,void>
              (&local_1b8.presentationHint,
               (VariablePresentationHint *)(anonymous_namespace)::PrivatePropertyHint);
    this_01 = &local_1b8.type;
    if ((this->SupportsVariableType & 1U) == 0) {
      memset(this_01,0,0x28);
      dap::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(this_01);
    }
    else {
      dap::optional<std::__cxx11::string>::optional<char_const(&)[11],void>
                ((optional<std::__cxx11::string> *)this_01,(char (*) [11])"collection");
    }
    peVar2 = std::
             __shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_50);
    GetValue_abi_cxx11_(&local_1b8.value,peVar2);
    peVar2 = std::
             __shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_50);
    i = GetId(peVar2);
    dap::integer::integer(&local_1b8.variablesReference,i);
    std::vector<dap::Variable,_std::allocator<dap::Variable>_>::emplace_back<dap::Variable>
              ((vector<dap::Variable,_std::allocator<dap::Variable>_> *)this_00,&local_1b8);
    dap::Variable::~Variable(&local_1b8);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<cmDebugger::cmDebuggerVariables>_*,_std::vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<dap::Variable,_std::allocator<dap::Variable>_>::~vector
            ((vector<dap::Variable,_std::allocator<dap::Variable>_> *)&__range1);
  return;
}

Assistant:

void cmDebuggerVariables::EnumerateSubVariablesIfAny(
  dap::array<dap::Variable>& toBeReturned) const
{
  dap::array<dap::Variable> ret;
  for (auto const& variables : SubVariables) {
    toBeReturned.emplace_back(dap::Variable{
      {},
      {},
      {},
      variables->GetName(),
      {},
      PrivatePropertyHint,
      SupportsVariableType ? "collection" : dap::optional<dap::string>(),
      variables->GetValue(),
      variables->GetId() });
  }
}